

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_tec(REF_HISTOGRAM ref_histogram,char *description)

{
  FILE *__stream;
  double dVar1;
  double dVar2;
  double local_470;
  REF_DBL portion;
  REF_DBL area;
  REF_DBL norm;
  char local_438 [4];
  REF_INT sum;
  char filename [1024];
  FILE *f;
  REF_INT i;
  char *description_local;
  REF_HISTOGRAM ref_histogram_local;
  
  norm._4_4_ = 0;
  for (f._4_4_ = 0; f._4_4_ < ref_histogram->nbin; f._4_4_ = f._4_4_ + 1) {
    norm._4_4_ = ref_histogram->bins[f._4_4_] + norm._4_4_;
  }
  area = 0.0;
  if (0 < norm._4_4_) {
    area = 1.0 / (double)norm._4_4_;
  }
  snprintf(local_438,0x400,"ref_histogram_%s.tec",description);
  __stream = fopen(local_438,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",local_438);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x109,"ref_histogram_tec","unable to open file");
    ref_histogram_local._4_4_ = 2;
  }
  else {
    for (f._4_4_ = 0; f._4_4_ < ref_histogram->nbin + -2; f._4_4_ = f._4_4_ + 1) {
      dVar1 = pow(2.0,(1.0 / ref_histogram->exp) * (double)((f._4_4_ + 1) - ref_histogram->nbin / 2)
                 );
      dVar2 = pow(2.0,(1.0 / ref_histogram->exp) * (double)(f._4_4_ - ref_histogram->nbin / 2));
      local_470 = ((double)ref_histogram->bins[f._4_4_] / (dVar1 - dVar2)) * area;
      if (local_470 <= 1e-20) {
        local_470 = 1e-20;
      }
      dVar1 = pow(2.0,(1.0 / ref_histogram->exp) * (double)(f._4_4_ - ref_histogram->nbin / 2));
      dVar2 = pow(2.0,(1.0 / ref_histogram->exp) * (double)((f._4_4_ + 1) - ref_histogram->nbin / 2)
                 );
      fprintf(__stream,"%.8e %.8e\n%.8e %.8e\n",dVar1,local_470,SUB84(dVar2,0),local_470);
    }
    fclose(__stream);
    ref_histogram_local._4_4_ = 0;
  }
  return ref_histogram_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_tec(REF_HISTOGRAM ref_histogram,
                                     const char *description) {
  REF_INT i;
  FILE *f;
  char filename[1024];
  REF_INT sum;
  REF_DBL norm, area, portion;

  sum = 0;
  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    sum += ref_histogram_bin(ref_histogram, i);
  norm = 0.0;
  if (0 < sum) norm = 1.0 / (REF_DBL)sum;

  snprintf(filename, 1024, "ref_histogram_%s.tec", description);
  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  for (i = 0; i < ref_histogram_nbin(ref_histogram) - 2; i++) {
    area = ref_histogram_to_obs(i + 1) - ref_histogram_to_obs(i);
    portion = (REF_DBL)ref_histogram_bin(ref_histogram, i) / area * norm;
    portion = MAX(portion, 1.0e-20);
    fprintf(f, "%.8e %.8e\n%.8e %.8e\n", ref_histogram_to_obs(i), portion,
            ref_histogram_to_obs(i + 1), portion);
  }

  fclose(f);

  return REF_SUCCESS;
}